

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlHashRemoveEntry(void)

{
  int iVar1;
  int iVar2;
  xmlHashTablePtr val;
  xmlChar *val_00;
  xmlHashDeallocator val_01;
  int local_44;
  int n_dealloc;
  xmlHashDeallocator dealloc;
  int n_key;
  xmlChar *key;
  int n_hash;
  xmlHashTablePtr hash;
  int ret_val;
  int mem_base;
  int test_ret;
  
  ret_val = 0;
  for (key._4_4_ = 0; (int)key._4_4_ < 2; key._4_4_ = key._4_4_ + 1) {
    for (dealloc._4_4_ = 0; (int)dealloc._4_4_ < 5; dealloc._4_4_ = dealloc._4_4_ + 1) {
      for (local_44 = 0; local_44 < 2; local_44 = local_44 + 1) {
        iVar1 = xmlMemBlocks();
        val = gen_xmlHashTablePtr(key._4_4_,0);
        val_00 = gen_const_xmlChar_ptr(dealloc._4_4_,1);
        val_01 = gen_xmlHashDeallocator(local_44,2);
        iVar2 = xmlHashRemoveEntry(val,val_00,val_01);
        desret_int(iVar2);
        call_tests = call_tests + 1;
        des_xmlHashTablePtr(key._4_4_,val,0);
        des_const_xmlChar_ptr(dealloc._4_4_,val_00,1);
        des_xmlHashDeallocator(local_44,val_01,2);
        xmlResetLastError();
        iVar2 = xmlMemBlocks();
        if (iVar1 != iVar2) {
          iVar2 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlHashRemoveEntry",(ulong)(uint)(iVar2 - iVar1));
          ret_val = ret_val + 1;
          printf(" %d",(ulong)key._4_4_);
          printf(" %d",(ulong)dealloc._4_4_);
          printf(" %d");
          printf("\n");
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val;
}

Assistant:

static int
test_xmlHashRemoveEntry(void) {
    int test_ret = 0;

    int mem_base;
    int ret_val;
    xmlHashTablePtr hash; /* hash table */
    int n_hash;
    const xmlChar * key; /* string key */
    int n_key;
    xmlHashDeallocator dealloc; /* deallocator function for removed item or NULL */
    int n_dealloc;

    for (n_hash = 0;n_hash < gen_nb_xmlHashTablePtr;n_hash++) {
    for (n_key = 0;n_key < gen_nb_const_xmlChar_ptr;n_key++) {
    for (n_dealloc = 0;n_dealloc < gen_nb_xmlHashDeallocator;n_dealloc++) {
        mem_base = xmlMemBlocks();
        hash = gen_xmlHashTablePtr(n_hash, 0);
        key = gen_const_xmlChar_ptr(n_key, 1);
        dealloc = gen_xmlHashDeallocator(n_dealloc, 2);

        ret_val = xmlHashRemoveEntry(hash, key, dealloc);
        desret_int(ret_val);
        call_tests++;
        des_xmlHashTablePtr(n_hash, hash, 0);
        des_const_xmlChar_ptr(n_key, key, 1);
        des_xmlHashDeallocator(n_dealloc, dealloc, 2);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlHashRemoveEntry",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_hash);
            printf(" %d", n_key);
            printf(" %d", n_dealloc);
            printf("\n");
        }
    }
    }
    }
    function_tests++;

    return(test_ret);
}